

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.h
# Opt level: O0

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* __thiscall
spvtools::opt::SpreadVolatileSemantics::EntryFunctionsToSpreadVolatileSemanticsForVar
          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,SpreadVolatileSemantics *this,uint32_t var_id)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_28;
  iterator itr;
  uint32_t var_id_local;
  SpreadVolatileSemantics *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur._4_4_ = var_id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->var_ids_to_entry_fn_for_volatile_semantics_,
              (key_type *)
              ((long)&itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->var_ids_to_entry_fn_for_volatile_semantics_);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x38);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set(__return_storage_ptr__);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                           *)&local_28);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set(__return_storage_ptr__,&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<uint32_t> EntryFunctionsToSpreadVolatileSemanticsForVar(
      uint32_t var_id) {
    auto itr = var_ids_to_entry_fn_for_volatile_semantics_.find(var_id);
    if (itr == var_ids_to_entry_fn_for_volatile_semantics_.end()) return {};
    return itr->second;
  }